

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acbFunc.c
# Opt level: O0

Vec_Int_t *
Acb_FindSupportMinOne
          (sat_solver *pSat,int iFirstDiv,Vec_Wrd_t *vPats,int *pnPats,Vec_Int_t *vSupp,int iVar)

{
  int iVar1;
  int iVar2;
  int *begin;
  int *end;
  word *p;
  Vec_Int_t *vLits;
  int nDivs;
  int status;
  int iLit;
  int i;
  int iVar_local;
  Vec_Int_t *vSupp_local;
  int *pnPats_local;
  Vec_Wrd_t *vPats_local;
  int iFirstDiv_local;
  sat_solver *pSat_local;
  
  iVar1 = Vec_WrdSize(vPats);
  iVar2 = Vec_IntSize(vSupp);
  pSat_local = (sat_solver *)Vec_IntAlloc(iVar2);
  for (status = 0; iVar2 = Vec_IntSize(vSupp), status < iVar2; status = status + 1) {
    iVar2 = Vec_IntEntry(vSupp,status);
    if (status != iVar) {
      Vec_IntPush((Vec_Int_t *)pSat_local,iVar2);
    }
  }
  begin = Vec_IntArray((Vec_Int_t *)pSat_local);
  end = Vec_IntLimit((Vec_Int_t *)pSat_local);
  iVar2 = sat_solver_solve(pSat,begin,end,0,0,0,0);
  if (iVar2 != -1) {
    Vec_IntFree((Vec_Int_t *)pSat_local);
    if (iVar2 != 1) {
      __assert_fail("status == l_True",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/acb/acbFunc.c"
                    ,0x40b,
                    "Vec_Int_t *Acb_FindSupportMinOne(sat_solver *, int, Vec_Wrd_t *, int *, Vec_Int_t *, int)"
                   );
    }
    for (status = 0; status < iVar1 / 0x100; status = status + 1) {
      iVar2 = sat_solver_var_value(pSat,iFirstDiv + status);
      if (iVar2 != 0) {
        p = Vec_WrdEntryP(vPats,status << 8);
        Abc_TtSetBit(p,*pnPats);
      }
    }
    *pnPats = *pnPats + 1;
    pSat_local = (sat_solver *)vSupp;
    if (*pnPats == 0x4000) {
      pSat_local = (sat_solver *)0x0;
    }
  }
  return (Vec_Int_t *)pSat_local;
}

Assistant:

Vec_Int_t * Acb_FindSupportMinOne( sat_solver * pSat, int iFirstDiv, Vec_Wrd_t * vPats, int * pnPats, Vec_Int_t * vSupp, int iVar )
{
    int i, iLit, status;
    int nDivs = Vec_WrdSize(vPats)/NWORDS;
    Vec_Int_t * vLits = Vec_IntAlloc( Vec_IntSize(vSupp) );
    Vec_IntForEachEntry( vSupp, iLit, i )
        if ( i != iVar )
            Vec_IntPush( vLits, iLit );
    // try one run
    status = sat_solver_solve( pSat, Vec_IntArray(vLits), Vec_IntLimit(vLits), 0, 0, 0, 0 );
    if ( status == l_False )
        return vLits;
    Vec_IntFree( vLits );
    assert( status == l_True );
    // collect pattern
    for ( i = 0; i < nDivs; i++ )
    {
        if ( sat_solver_var_value(pSat, iFirstDiv+i) == 0 )
            continue;
        Abc_TtSetBit( Vec_WrdEntryP(vPats, NWORDS*i), *pnPats );
    }
    (*pnPats)++;
    if ( *pnPats == NWORDS*64 )
        return NULL;
    return vSupp;
}